

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstr.hpp
# Opt level: O0

int __thiscall zstr::ifstream::open(ifstream *this,char *__file,int __oflag,...)

{
  _func_int *p_Var1;
  istream *piVar2;
  int extraout_EAX;
  streambuf *psVar3;
  unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
  oldbuf;
  pointer in_stack_fffffffffffffe88;
  undefined1 local_148 [80];
  int in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  size_t in_stack_ffffffffffffff10;
  streambuf *in_stack_ffffffffffffff18;
  istreambuf *in_stack_ffffffffffffff20;
  
  strict_fstream::ifstream::open((ifstream *)&(this->super_istream).field_0x10,__file,__oflag);
  p_Var1 = (this->super_istream)._vptr_basic_istream[-3];
  piVar2 = &this->super_istream;
  operator_new(0x80);
  std::ifstream::rdbuf();
  istreambuf::istreambuf
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
             (bool)in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08);
  std::ios::rdbuf((streambuf *)((long)&piVar2->_vptr_basic_istream + (long)p_Var1));
  std::unique_ptr<std::streambuf,std::default_delete<std::streambuf>>::
  unique_ptr<std::default_delete<std::streambuf>,void>
            ((unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
              *)this,in_stack_fffffffffffffe88);
  psVar3 = (streambuf *)std::ios::rdbuf();
  std::istream::istream(local_148,psVar3);
  std::istream::operator=(this,(istream *)local_148);
  std::istream::~istream(local_148);
  std::
  unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
                 *)this);
  return extraout_EAX;
}

Assistant:

void open(const std::string filename,
            std::ios_base::openmode mode = std::ios_base::in) {
    _fs.open(filename, mode
#ifdef _WIN32  // to avoid problems with conversion of \r\n, only windows as
               // otherwise there are problems on mac
                           | std::ios_base::binary
#endif
    );
    // make sure the previous buffer is deleted by putting it into a unique_ptr
    // and set a new one after opening file
    std::unique_ptr<std::streambuf> oldbuf(rdbuf(new istreambuf(_fs.rdbuf())));
    // call move assignment operator on istream which does not alter the stream
    // buffer
    std::istream::operator=(std::istream(rdbuf()));
  }